

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

FIOBJ http_mimetype_find2(FIOBJ url)

{
  FIOBJ FVar1;
  __int32_t **pp_Var2;
  FIOBJ FVar3;
  byte bVar4;
  char *file_ext;
  long lVar5;
  byte bVar6;
  long lVar7;
  size_t file_ext_len;
  long *in_FS_OFFSET;
  fio_str_info_s tmp;
  fio_str_info_s fStack_48;
  
  if (url != 0) {
    fiobj_obj2cstr(&fStack_48,url);
    bVar6 = 0;
    do {
      bVar4 = bVar6;
      bVar6 = bVar4 + 1;
      lVar7 = fStack_48.len - bVar6;
      if ((bVar6 < 0xf && (fStack_48.len < bVar6 || lVar7 == 0)) || (fStack_48.data[lVar7] == '/'))
      goto LAB_00143340;
    } while (fStack_48.data[lVar7] != '.');
    if (bVar4 != 0) {
      file_ext_len = (size_t)bVar4;
      lVar7 = *in_FS_OFFSET;
      file_ext = (char *)(lVar7 + -0x10);
      *(undefined1 *)((long)in_FS_OFFSET + (file_ext_len - 0x10)) = 0;
      for (lVar5 = 0; -lVar5 != file_ext_len; lVar5 = lVar5 + -1) {
        pp_Var2 = __ctype_tolower_loc();
        *(char *)(lVar7 + file_ext_len + -0x11 + lVar5) =
             (char)(*pp_Var2)[fStack_48.data[lVar5 + (fStack_48.len - 1)]];
      }
      goto LAB_00143343;
    }
  }
LAB_00143340:
  file_ext = (char *)0x0;
  file_ext_len = 0;
LAB_00143343:
  FVar3 = http_mimetype_find(file_ext,file_ext_len);
  FVar1 = HTTP_HVALUE_CONTENT_TYPE_DEFAULT;
  if (FVar3 == 0) {
    fiobj_dup(HTTP_HVALUE_CONTENT_TYPE_DEFAULT);
    FVar3 = FVar1;
  }
  return FVar3;
}

Assistant:

FIOBJ http_mimetype_find2(FIOBJ url) {
  static __thread char buffer[LONGEST_FILE_EXTENSION_LENGTH + 1];
  fio_str_info_s ext = {.data = NULL};
  FIOBJ mimetype;
  if (!url)
    goto finish;
  fio_str_info_s tmp = fiobj_obj2cstr(url);
  uint8_t steps = 1;
  while (tmp.len > steps || steps >= LONGEST_FILE_EXTENSION_LENGTH) {
    switch (tmp.data[tmp.len - steps]) {
    case '.':
      --steps;
      if (steps) {
        ext.len = steps;
        ext.data = buffer;
        buffer[steps] = 0;
        for (size_t i = 1; i <= steps; ++i) {
          buffer[steps - i] = tolower(tmp.data[tmp.len - i]);
        }
      }
    /* fallthrough */
    case '/':
      goto finish;
      break;
    }
    ++steps;
  }
finish:
  mimetype = http_mimetype_find(ext.data, ext.len);
  if (!mimetype)
    mimetype = fiobj_dup(HTTP_HVALUE_CONTENT_TYPE_DEFAULT);
  return mimetype;
}